

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O1

void rf_draw_texture_npatch
               (rf_texture2d texture,rf_npatch_info n_patch_info,rf_rec dest_rec,rf_vec2 origin,
               float rotation,rf_color tint)

{
  int iVar1;
  rf_render_batch *prVar2;
  long lVar3;
  rf_vertex_buffer *prVar4;
  rf_gfx_texcoord_data_type *prVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  float fVar9;
  float fVar10;
  float x;
  float fVar11;
  float x_00;
  float y;
  float x_01;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float local_90;
  float local_78;
  float fStack_74;
  float local_68;
  float fStack_64;
  float local_34;
  
  if (texture.id == 0) {
    return;
  }
  if (n_patch_info.source_rec.width < 0.0) {
    n_patch_info.source_rec.x = n_patch_info.source_rec.x - n_patch_info.source_rec.width;
  }
  if (n_patch_info.source_rec.height < 0.0) {
    n_patch_info.source_rec.y = n_patch_info.source_rec.y - n_patch_info.source_rec.height;
  }
  bVar7 = n_patch_info.type == 2;
  fVar12 = n_patch_info.source_rec.height;
  if (!bVar7) {
    fVar12 = (float)(~-(uint)(dest_rec.height <= 0.0) & (uint)dest_rec.height);
  }
  bVar8 = n_patch_info.type == 1;
  x_01 = n_patch_info.source_rec.width;
  if (!bVar8) {
    x_01 = (float)(~-(uint)(dest_rec.width <= 0.0) & (uint)dest_rec.width);
  }
  x = (float)n_patch_info.left;
  local_90 = (float)n_patch_info.top;
  fVar15 = (float)n_patch_info.right;
  local_34 = (float)n_patch_info.bottom;
  bVar6 = x + fVar15 < x_01;
  if (!bVar8 && !bVar6) {
    x = (x / (x + fVar15)) * x_01;
    fVar15 = x_01 - x;
  }
  fVar9 = (float)texture.width;
  fVar11 = (float)texture.height;
  fVar10 = local_90 + local_34;
  if (!bVar7 && fVar10 >= fVar12) {
    local_90 = (local_90 / fVar10) * fVar12;
    local_34 = fVar12 - local_90;
  }
  rf_gfx_enable_texture(texture.id);
  rf_gfx_push_matrix();
  local_78 = dest_rec.x;
  fStack_74 = dest_rec.y;
  rf_gfx_translatef(local_78,fStack_74,0.0);
  rf_gfx_rotatef(rotation,0.0,0.0,1.0);
  local_68 = origin.x;
  fStack_64 = origin.y;
  rf_gfx_translatef(-local_68,-fStack_64,0.0);
  rf_gfx_begin(RF_QUADS);
  rf_gfx_color4ub(tint.r,tint.g,tint.b,tint.a);
  x_00 = x_01 - fVar15;
  fVar14 = n_patch_info.source_rec.x / fVar9;
  fVar18 = n_patch_info.source_rec.y / fVar11;
  fVar16 = (n_patch_info.source_rec.x + x) / fVar9;
  fVar15 = ((n_patch_info.source_rec.width + n_patch_info.source_rec.x) - fVar15) / fVar9;
  fVar9 = (n_patch_info.source_rec.width + n_patch_info.source_rec.x) / fVar9;
  fVar13 = (n_patch_info.source_rec.height + n_patch_info.source_rec.y) / fVar11;
  if (n_patch_info.type == 2) {
    prVar2 = (rf__ctx->field_0).current_batch;
    lVar3 = prVar2->current_buffer;
    prVar4 = prVar2->vertex_buffers;
    prVar5 = prVar4[lVar3].texcoords;
    iVar1 = prVar4[lVar3].tc_counter;
    prVar5[(long)iVar1 * 2] = fVar14;
    prVar5[iVar1 * 2 + 1] = fVar13;
    prVar4[lVar3].tc_counter = prVar4[lVar3].tc_counter + 1;
    rf_gfx_vertex3f(0.0,fVar12,prVar2->current_depth);
    prVar2 = (rf__ctx->field_0).current_batch;
    lVar3 = prVar2->current_buffer;
    prVar4 = prVar2->vertex_buffers;
    prVar5 = prVar4[lVar3].texcoords;
    iVar1 = prVar4[lVar3].tc_counter;
    prVar5[(long)iVar1 * 2] = fVar16;
    prVar5[iVar1 * 2 + 1] = fVar13;
    prVar4[lVar3].tc_counter = prVar4[lVar3].tc_counter + 1;
    rf_gfx_vertex3f(x,fVar12,prVar2->current_depth);
    prVar2 = (rf__ctx->field_0).current_batch;
    lVar3 = prVar2->current_buffer;
    prVar4 = prVar2->vertex_buffers;
    prVar5 = prVar4[lVar3].texcoords;
    iVar1 = prVar4[lVar3].tc_counter;
    prVar5[(long)iVar1 * 2] = fVar16;
    prVar5[iVar1 * 2 + 1] = fVar18;
    prVar4[lVar3].tc_counter = prVar4[lVar3].tc_counter + 1;
    rf_gfx_vertex3f(x,0.0,prVar2->current_depth);
    prVar2 = (rf__ctx->field_0).current_batch;
    lVar3 = prVar2->current_buffer;
    prVar4 = prVar2->vertex_buffers;
    prVar5 = prVar4[lVar3].texcoords;
    iVar1 = prVar4[lVar3].tc_counter;
    prVar5[(long)iVar1 * 2] = fVar14;
    prVar5[iVar1 * 2 + 1] = fVar18;
    prVar4[lVar3].tc_counter = prVar4[lVar3].tc_counter + 1;
    rf_gfx_vertex3f(0.0,0.0,prVar2->current_depth);
    if (bVar8 || bVar6) {
      prVar2 = (rf__ctx->field_0).current_batch;
      lVar3 = prVar2->current_buffer;
      prVar4 = prVar2->vertex_buffers;
      prVar5 = prVar4[lVar3].texcoords;
      iVar1 = prVar4[lVar3].tc_counter;
      prVar5[(long)iVar1 * 2] = fVar16;
      prVar5[iVar1 * 2 + 1] = fVar13;
      prVar4[lVar3].tc_counter = prVar4[lVar3].tc_counter + 1;
      rf_gfx_vertex3f(x,fVar12,prVar2->current_depth);
      prVar2 = (rf__ctx->field_0).current_batch;
      lVar3 = prVar2->current_buffer;
      prVar4 = prVar2->vertex_buffers;
      prVar5 = prVar4[lVar3].texcoords;
      iVar1 = prVar4[lVar3].tc_counter;
      prVar5[(long)iVar1 * 2] = fVar15;
      prVar5[iVar1 * 2 + 1] = fVar13;
      prVar4[lVar3].tc_counter = prVar4[lVar3].tc_counter + 1;
      rf_gfx_vertex3f(x_00,fVar12,prVar2->current_depth);
      prVar2 = (rf__ctx->field_0).current_batch;
      lVar3 = prVar2->current_buffer;
      prVar4 = prVar2->vertex_buffers;
      prVar5 = prVar4[lVar3].texcoords;
      iVar1 = prVar4[lVar3].tc_counter;
      prVar5[(long)iVar1 * 2] = fVar15;
      prVar5[iVar1 * 2 + 1] = fVar18;
      prVar4[lVar3].tc_counter = prVar4[lVar3].tc_counter + 1;
      rf_gfx_vertex3f(x_00,0.0,prVar2->current_depth);
      prVar2 = (rf__ctx->field_0).current_batch;
      lVar3 = prVar2->current_buffer;
      prVar4 = prVar2->vertex_buffers;
      prVar5 = prVar4[lVar3].texcoords;
      iVar1 = prVar4[lVar3].tc_counter;
      prVar5[(long)iVar1 * 2] = fVar16;
      prVar5[iVar1 * 2 + 1] = fVar18;
      prVar4[lVar3].tc_counter = prVar4[lVar3].tc_counter + 1;
      rf_gfx_vertex3f(x,0.0,prVar2->current_depth);
    }
    prVar2 = (rf__ctx->field_0).current_batch;
    lVar3 = prVar2->current_buffer;
    prVar4 = prVar2->vertex_buffers;
    prVar5 = prVar4[lVar3].texcoords;
    iVar1 = prVar4[lVar3].tc_counter;
    prVar5[(long)iVar1 * 2] = fVar15;
    prVar5[iVar1 * 2 + 1] = fVar13;
    prVar4[lVar3].tc_counter = prVar4[lVar3].tc_counter + 1;
    rf_gfx_vertex3f(x_00,fVar12,prVar2->current_depth);
    prVar2 = (rf__ctx->field_0).current_batch;
    lVar3 = prVar2->current_buffer;
    prVar4 = prVar2->vertex_buffers;
    prVar5 = prVar4[lVar3].texcoords;
    iVar1 = prVar4[lVar3].tc_counter;
    prVar5[(long)iVar1 * 2] = fVar9;
    prVar5[iVar1 * 2 + 1] = fVar13;
    prVar4[lVar3].tc_counter = prVar4[lVar3].tc_counter + 1;
    rf_gfx_vertex3f(x_01,fVar12,prVar2->current_depth);
    prVar2 = (rf__ctx->field_0).current_batch;
    lVar3 = prVar2->current_buffer;
    prVar4 = prVar2->vertex_buffers;
    prVar5 = prVar4[lVar3].texcoords;
    iVar1 = prVar4[lVar3].tc_counter;
    prVar5[(long)iVar1 * 2] = fVar9;
    prVar5[iVar1 * 2 + 1] = fVar18;
    prVar4[lVar3].tc_counter = prVar4[lVar3].tc_counter + 1;
    rf_gfx_vertex3f(x_01,0.0,prVar2->current_depth);
    prVar2 = (rf__ctx->field_0).current_batch;
    lVar3 = prVar2->current_buffer;
    prVar4 = prVar2->vertex_buffers;
    prVar5 = prVar4[lVar3].texcoords;
    iVar1 = prVar4[lVar3].tc_counter;
    prVar5[(long)iVar1 * 2] = fVar15;
    prVar5[iVar1 * 2 + 1] = fVar18;
    prVar4[lVar3].tc_counter = prVar4[lVar3].tc_counter + 1;
    fVar12 = prVar2->current_depth;
    y = 0.0;
  }
  else {
    y = fVar12 - local_34;
    fVar17 = (n_patch_info.source_rec.y + local_90) / fVar11;
    fVar11 = ((n_patch_info.source_rec.height + n_patch_info.source_rec.y) - local_34) / fVar11;
    if (n_patch_info.type == 1) {
      prVar2 = (rf__ctx->field_0).current_batch;
      lVar3 = prVar2->current_buffer;
      prVar4 = prVar2->vertex_buffers;
      prVar5 = prVar4[lVar3].texcoords;
      iVar1 = prVar4[lVar3].tc_counter;
      prVar5[(long)iVar1 * 2] = fVar14;
      prVar5[iVar1 * 2 + 1] = fVar17;
      prVar4[lVar3].tc_counter = prVar4[lVar3].tc_counter + 1;
      rf_gfx_vertex3f(0.0,local_90,prVar2->current_depth);
      prVar2 = (rf__ctx->field_0).current_batch;
      lVar3 = prVar2->current_buffer;
      prVar4 = prVar2->vertex_buffers;
      prVar5 = prVar4[lVar3].texcoords;
      iVar1 = prVar4[lVar3].tc_counter;
      prVar5[(long)iVar1 * 2] = fVar9;
      prVar5[iVar1 * 2 + 1] = fVar17;
      prVar4[lVar3].tc_counter = prVar4[lVar3].tc_counter + 1;
      rf_gfx_vertex3f(x_01,local_90,prVar2->current_depth);
      prVar2 = (rf__ctx->field_0).current_batch;
      lVar3 = prVar2->current_buffer;
      prVar4 = prVar2->vertex_buffers;
      prVar5 = prVar4[lVar3].texcoords;
      iVar1 = prVar4[lVar3].tc_counter;
      prVar5[(long)iVar1 * 2] = fVar9;
      prVar5[iVar1 * 2 + 1] = fVar18;
      prVar4[lVar3].tc_counter = prVar4[lVar3].tc_counter + 1;
      rf_gfx_vertex3f(x_01,0.0,prVar2->current_depth);
      prVar2 = (rf__ctx->field_0).current_batch;
      lVar3 = prVar2->current_buffer;
      prVar4 = prVar2->vertex_buffers;
      prVar5 = prVar4[lVar3].texcoords;
      iVar1 = prVar4[lVar3].tc_counter;
      prVar5[(long)iVar1 * 2] = fVar14;
      prVar5[iVar1 * 2 + 1] = fVar18;
      prVar4[lVar3].tc_counter = prVar4[lVar3].tc_counter + 1;
      rf_gfx_vertex3f(0.0,0.0,prVar2->current_depth);
      if (bVar8 || bVar6) {
        prVar2 = (rf__ctx->field_0).current_batch;
        lVar3 = prVar2->current_buffer;
        prVar4 = prVar2->vertex_buffers;
        prVar5 = prVar4[lVar3].texcoords;
        iVar1 = prVar4[lVar3].tc_counter;
        prVar5[(long)iVar1 * 2] = fVar14;
        prVar5[iVar1 * 2 + 1] = fVar11;
        prVar4[lVar3].tc_counter = prVar4[lVar3].tc_counter + 1;
        rf_gfx_vertex3f(0.0,y,prVar2->current_depth);
        prVar2 = (rf__ctx->field_0).current_batch;
        lVar3 = prVar2->current_buffer;
        prVar4 = prVar2->vertex_buffers;
        prVar5 = prVar4[lVar3].texcoords;
        iVar1 = prVar4[lVar3].tc_counter;
        prVar5[(long)iVar1 * 2] = fVar9;
        prVar5[iVar1 * 2 + 1] = fVar11;
        prVar4[lVar3].tc_counter = prVar4[lVar3].tc_counter + 1;
        rf_gfx_vertex3f(x_01,y,prVar2->current_depth);
        prVar2 = (rf__ctx->field_0).current_batch;
        lVar3 = prVar2->current_buffer;
        prVar4 = prVar2->vertex_buffers;
        prVar5 = prVar4[lVar3].texcoords;
        iVar1 = prVar4[lVar3].tc_counter;
        prVar5[(long)iVar1 * 2] = fVar9;
        prVar5[iVar1 * 2 + 1] = fVar17;
        prVar4[lVar3].tc_counter = prVar4[lVar3].tc_counter + 1;
        rf_gfx_vertex3f(x_01,local_90,prVar2->current_depth);
        prVar2 = (rf__ctx->field_0).current_batch;
        lVar3 = prVar2->current_buffer;
        prVar4 = prVar2->vertex_buffers;
        prVar5 = prVar4[lVar3].texcoords;
        iVar1 = prVar4[lVar3].tc_counter;
        prVar5[(long)iVar1 * 2] = fVar14;
        prVar5[iVar1 * 2 + 1] = fVar17;
        prVar4[lVar3].tc_counter = prVar4[lVar3].tc_counter + 1;
        rf_gfx_vertex3f(0.0,local_90,prVar2->current_depth);
      }
      prVar2 = (rf__ctx->field_0).current_batch;
      lVar3 = prVar2->current_buffer;
      prVar4 = prVar2->vertex_buffers;
      prVar5 = prVar4[lVar3].texcoords;
      iVar1 = prVar4[lVar3].tc_counter;
      prVar5[(long)iVar1 * 2] = fVar14;
      prVar5[iVar1 * 2 + 1] = fVar13;
      prVar4[lVar3].tc_counter = prVar4[lVar3].tc_counter + 1;
      rf_gfx_vertex3f(0.0,fVar12,prVar2->current_depth);
      prVar2 = (rf__ctx->field_0).current_batch;
      lVar3 = prVar2->current_buffer;
      prVar4 = prVar2->vertex_buffers;
      prVar5 = prVar4[lVar3].texcoords;
      iVar1 = prVar4[lVar3].tc_counter;
      prVar5[(long)iVar1 * 2] = fVar9;
      prVar5[iVar1 * 2 + 1] = fVar13;
      prVar4[lVar3].tc_counter = prVar4[lVar3].tc_counter + 1;
      rf_gfx_vertex3f(x_01,fVar12,prVar2->current_depth);
      prVar2 = (rf__ctx->field_0).current_batch;
      lVar3 = prVar2->current_buffer;
      prVar4 = prVar2->vertex_buffers;
      prVar5 = prVar4[lVar3].texcoords;
      iVar1 = prVar4[lVar3].tc_counter;
      prVar5[(long)iVar1 * 2] = fVar9;
      prVar5[iVar1 * 2 + 1] = fVar11;
      prVar4[lVar3].tc_counter = prVar4[lVar3].tc_counter + 1;
      rf_gfx_vertex3f(x_01,y,prVar2->current_depth);
      prVar2 = (rf__ctx->field_0).current_batch;
      lVar3 = prVar2->current_buffer;
      prVar4 = prVar2->vertex_buffers;
      prVar5 = prVar4[lVar3].texcoords;
      iVar1 = prVar4[lVar3].tc_counter;
      prVar5[(long)iVar1 * 2] = fVar14;
      prVar5[iVar1 * 2 + 1] = fVar11;
      prVar4[lVar3].tc_counter = prVar4[lVar3].tc_counter + 1;
      fVar12 = prVar2->current_depth;
      x_00 = 0.0;
    }
    else {
      if (n_patch_info.type != 0) goto LAB_0014ee62;
      prVar2 = (rf__ctx->field_0).current_batch;
      lVar3 = prVar2->current_buffer;
      prVar4 = prVar2->vertex_buffers;
      prVar5 = prVar4[lVar3].texcoords;
      iVar1 = prVar4[lVar3].tc_counter;
      prVar5[(long)iVar1 * 2] = fVar14;
      prVar5[iVar1 * 2 + 1] = fVar17;
      prVar4[lVar3].tc_counter = prVar4[lVar3].tc_counter + 1;
      rf_gfx_vertex3f(0.0,local_90,prVar2->current_depth);
      prVar2 = (rf__ctx->field_0).current_batch;
      lVar3 = prVar2->current_buffer;
      prVar4 = prVar2->vertex_buffers;
      prVar5 = prVar4[lVar3].texcoords;
      iVar1 = prVar4[lVar3].tc_counter;
      prVar5[(long)iVar1 * 2] = fVar16;
      prVar5[iVar1 * 2 + 1] = fVar17;
      prVar4[lVar3].tc_counter = prVar4[lVar3].tc_counter + 1;
      rf_gfx_vertex3f(x,local_90,prVar2->current_depth);
      prVar2 = (rf__ctx->field_0).current_batch;
      lVar3 = prVar2->current_buffer;
      prVar4 = prVar2->vertex_buffers;
      prVar5 = prVar4[lVar3].texcoords;
      iVar1 = prVar4[lVar3].tc_counter;
      prVar5[(long)iVar1 * 2] = fVar16;
      prVar5[iVar1 * 2 + 1] = fVar18;
      prVar4[lVar3].tc_counter = prVar4[lVar3].tc_counter + 1;
      rf_gfx_vertex3f(x,0.0,prVar2->current_depth);
      prVar2 = (rf__ctx->field_0).current_batch;
      lVar3 = prVar2->current_buffer;
      prVar4 = prVar2->vertex_buffers;
      prVar5 = prVar4[lVar3].texcoords;
      iVar1 = prVar4[lVar3].tc_counter;
      prVar5[(long)iVar1 * 2] = fVar14;
      prVar5[iVar1 * 2 + 1] = fVar18;
      prVar4[lVar3].tc_counter = prVar4[lVar3].tc_counter + 1;
      rf_gfx_vertex3f(0.0,0.0,prVar2->current_depth);
      if (bVar8 || bVar6) {
        prVar2 = (rf__ctx->field_0).current_batch;
        lVar3 = prVar2->current_buffer;
        prVar4 = prVar2->vertex_buffers;
        prVar5 = prVar4[lVar3].texcoords;
        iVar1 = prVar4[lVar3].tc_counter;
        prVar5[(long)iVar1 * 2] = fVar16;
        prVar5[iVar1 * 2 + 1] = fVar17;
        prVar4[lVar3].tc_counter = prVar4[lVar3].tc_counter + 1;
        rf_gfx_vertex3f(x,local_90,prVar2->current_depth);
        prVar2 = (rf__ctx->field_0).current_batch;
        lVar3 = prVar2->current_buffer;
        prVar4 = prVar2->vertex_buffers;
        prVar5 = prVar4[lVar3].texcoords;
        iVar1 = prVar4[lVar3].tc_counter;
        prVar5[(long)iVar1 * 2] = fVar15;
        prVar5[iVar1 * 2 + 1] = fVar17;
        prVar4[lVar3].tc_counter = prVar4[lVar3].tc_counter + 1;
        rf_gfx_vertex3f(x_00,local_90,prVar2->current_depth);
        prVar2 = (rf__ctx->field_0).current_batch;
        lVar3 = prVar2->current_buffer;
        prVar4 = prVar2->vertex_buffers;
        prVar5 = prVar4[lVar3].texcoords;
        iVar1 = prVar4[lVar3].tc_counter;
        prVar5[(long)iVar1 * 2] = fVar15;
        prVar5[iVar1 * 2 + 1] = fVar18;
        prVar4[lVar3].tc_counter = prVar4[lVar3].tc_counter + 1;
        rf_gfx_vertex3f(x_00,0.0,prVar2->current_depth);
        prVar2 = (rf__ctx->field_0).current_batch;
        lVar3 = prVar2->current_buffer;
        prVar4 = prVar2->vertex_buffers;
        prVar5 = prVar4[lVar3].texcoords;
        iVar1 = prVar4[lVar3].tc_counter;
        prVar5[(long)iVar1 * 2] = fVar16;
        prVar5[iVar1 * 2 + 1] = fVar18;
        prVar4[lVar3].tc_counter = prVar4[lVar3].tc_counter + 1;
        rf_gfx_vertex3f(x,0.0,prVar2->current_depth);
      }
      prVar2 = (rf__ctx->field_0).current_batch;
      lVar3 = prVar2->current_buffer;
      prVar4 = prVar2->vertex_buffers;
      prVar5 = prVar4[lVar3].texcoords;
      iVar1 = prVar4[lVar3].tc_counter;
      prVar5[(long)iVar1 * 2] = fVar15;
      prVar5[iVar1 * 2 + 1] = fVar17;
      prVar4[lVar3].tc_counter = prVar4[lVar3].tc_counter + 1;
      rf_gfx_vertex3f(x_00,local_90,prVar2->current_depth);
      prVar2 = (rf__ctx->field_0).current_batch;
      lVar3 = prVar2->current_buffer;
      prVar4 = prVar2->vertex_buffers;
      prVar5 = prVar4[lVar3].texcoords;
      iVar1 = prVar4[lVar3].tc_counter;
      prVar5[(long)iVar1 * 2] = fVar9;
      prVar5[iVar1 * 2 + 1] = fVar17;
      prVar4[lVar3].tc_counter = prVar4[lVar3].tc_counter + 1;
      rf_gfx_vertex3f(x_01,local_90,prVar2->current_depth);
      prVar2 = (rf__ctx->field_0).current_batch;
      lVar3 = prVar2->current_buffer;
      prVar4 = prVar2->vertex_buffers;
      prVar5 = prVar4[lVar3].texcoords;
      iVar1 = prVar4[lVar3].tc_counter;
      prVar5[(long)iVar1 * 2] = fVar9;
      prVar5[iVar1 * 2 + 1] = fVar18;
      prVar4[lVar3].tc_counter = prVar4[lVar3].tc_counter + 1;
      rf_gfx_vertex3f(x_01,0.0,prVar2->current_depth);
      prVar2 = (rf__ctx->field_0).current_batch;
      lVar3 = prVar2->current_buffer;
      prVar4 = prVar2->vertex_buffers;
      prVar5 = prVar4[lVar3].texcoords;
      iVar1 = prVar4[lVar3].tc_counter;
      prVar5[(long)iVar1 * 2] = fVar15;
      prVar5[iVar1 * 2 + 1] = fVar18;
      prVar4[lVar3].tc_counter = prVar4[lVar3].tc_counter + 1;
      rf_gfx_vertex3f(x_00,0.0,prVar2->current_depth);
      if (bVar7 || fVar10 < fVar12) {
        prVar2 = (rf__ctx->field_0).current_batch;
        lVar3 = prVar2->current_buffer;
        prVar4 = prVar2->vertex_buffers;
        prVar5 = prVar4[lVar3].texcoords;
        iVar1 = prVar4[lVar3].tc_counter;
        prVar5[(long)iVar1 * 2] = fVar14;
        prVar5[iVar1 * 2 + 1] = fVar11;
        prVar4[lVar3].tc_counter = prVar4[lVar3].tc_counter + 1;
        rf_gfx_vertex3f(0.0,y,prVar2->current_depth);
        prVar2 = (rf__ctx->field_0).current_batch;
        lVar3 = prVar2->current_buffer;
        prVar4 = prVar2->vertex_buffers;
        prVar5 = prVar4[lVar3].texcoords;
        iVar1 = prVar4[lVar3].tc_counter;
        prVar5[(long)iVar1 * 2] = fVar16;
        prVar5[iVar1 * 2 + 1] = fVar11;
        prVar4[lVar3].tc_counter = prVar4[lVar3].tc_counter + 1;
        rf_gfx_vertex3f(x,y,prVar2->current_depth);
        prVar2 = (rf__ctx->field_0).current_batch;
        lVar3 = prVar2->current_buffer;
        prVar4 = prVar2->vertex_buffers;
        prVar5 = prVar4[lVar3].texcoords;
        iVar1 = prVar4[lVar3].tc_counter;
        prVar5[(long)iVar1 * 2] = fVar16;
        prVar5[iVar1 * 2 + 1] = fVar17;
        prVar4[lVar3].tc_counter = prVar4[lVar3].tc_counter + 1;
        rf_gfx_vertex3f(x,local_90,prVar2->current_depth);
        prVar2 = (rf__ctx->field_0).current_batch;
        lVar3 = prVar2->current_buffer;
        prVar4 = prVar2->vertex_buffers;
        prVar5 = prVar4[lVar3].texcoords;
        iVar1 = prVar4[lVar3].tc_counter;
        prVar5[(long)iVar1 * 2] = fVar14;
        prVar5[iVar1 * 2 + 1] = fVar17;
        prVar4[lVar3].tc_counter = prVar4[lVar3].tc_counter + 1;
        rf_gfx_vertex3f(0.0,local_90,prVar2->current_depth);
        if (bVar8 || bVar6) {
          prVar2 = (rf__ctx->field_0).current_batch;
          lVar3 = prVar2->current_buffer;
          prVar4 = prVar2->vertex_buffers;
          prVar5 = prVar4[lVar3].texcoords;
          iVar1 = prVar4[lVar3].tc_counter;
          prVar5[(long)iVar1 * 2] = fVar16;
          prVar5[iVar1 * 2 + 1] = fVar11;
          prVar4[lVar3].tc_counter = prVar4[lVar3].tc_counter + 1;
          rf_gfx_vertex3f(x,y,prVar2->current_depth);
          prVar2 = (rf__ctx->field_0).current_batch;
          lVar3 = prVar2->current_buffer;
          prVar4 = prVar2->vertex_buffers;
          prVar5 = prVar4[lVar3].texcoords;
          iVar1 = prVar4[lVar3].tc_counter;
          prVar5[(long)iVar1 * 2] = fVar15;
          prVar5[iVar1 * 2 + 1] = fVar11;
          prVar4[lVar3].tc_counter = prVar4[lVar3].tc_counter + 1;
          rf_gfx_vertex3f(x_00,y,prVar2->current_depth);
          prVar2 = (rf__ctx->field_0).current_batch;
          lVar3 = prVar2->current_buffer;
          prVar4 = prVar2->vertex_buffers;
          prVar5 = prVar4[lVar3].texcoords;
          iVar1 = prVar4[lVar3].tc_counter;
          prVar5[(long)iVar1 * 2] = fVar15;
          prVar5[iVar1 * 2 + 1] = fVar17;
          prVar4[lVar3].tc_counter = prVar4[lVar3].tc_counter + 1;
          rf_gfx_vertex3f(x_00,local_90,prVar2->current_depth);
          prVar2 = (rf__ctx->field_0).current_batch;
          lVar3 = prVar2->current_buffer;
          prVar4 = prVar2->vertex_buffers;
          prVar5 = prVar4[lVar3].texcoords;
          iVar1 = prVar4[lVar3].tc_counter;
          prVar5[(long)iVar1 * 2] = fVar16;
          prVar5[iVar1 * 2 + 1] = fVar17;
          prVar4[lVar3].tc_counter = prVar4[lVar3].tc_counter + 1;
          rf_gfx_vertex3f(x,local_90,prVar2->current_depth);
        }
        prVar2 = (rf__ctx->field_0).current_batch;
        lVar3 = prVar2->current_buffer;
        prVar4 = prVar2->vertex_buffers;
        prVar5 = prVar4[lVar3].texcoords;
        iVar1 = prVar4[lVar3].tc_counter;
        prVar5[(long)iVar1 * 2] = fVar15;
        prVar5[iVar1 * 2 + 1] = fVar11;
        prVar4[lVar3].tc_counter = prVar4[lVar3].tc_counter + 1;
        rf_gfx_vertex3f(x_00,y,prVar2->current_depth);
        prVar2 = (rf__ctx->field_0).current_batch;
        lVar3 = prVar2->current_buffer;
        prVar4 = prVar2->vertex_buffers;
        prVar5 = prVar4[lVar3].texcoords;
        iVar1 = prVar4[lVar3].tc_counter;
        prVar5[(long)iVar1 * 2] = fVar9;
        prVar5[iVar1 * 2 + 1] = fVar11;
        prVar4[lVar3].tc_counter = prVar4[lVar3].tc_counter + 1;
        rf_gfx_vertex3f(x_01,y,prVar2->current_depth);
        prVar2 = (rf__ctx->field_0).current_batch;
        lVar3 = prVar2->current_buffer;
        prVar4 = prVar2->vertex_buffers;
        prVar5 = prVar4[lVar3].texcoords;
        iVar1 = prVar4[lVar3].tc_counter;
        prVar5[(long)iVar1 * 2] = fVar9;
        prVar5[iVar1 * 2 + 1] = fVar17;
        prVar4[lVar3].tc_counter = prVar4[lVar3].tc_counter + 1;
        rf_gfx_vertex3f(x_01,local_90,prVar2->current_depth);
        prVar2 = (rf__ctx->field_0).current_batch;
        lVar3 = prVar2->current_buffer;
        prVar4 = prVar2->vertex_buffers;
        prVar5 = prVar4[lVar3].texcoords;
        iVar1 = prVar4[lVar3].tc_counter;
        prVar5[(long)iVar1 * 2] = fVar15;
        prVar5[iVar1 * 2 + 1] = fVar17;
        prVar4[lVar3].tc_counter = prVar4[lVar3].tc_counter + 1;
        rf_gfx_vertex3f(x_00,local_90,prVar2->current_depth);
      }
      prVar2 = (rf__ctx->field_0).current_batch;
      lVar3 = prVar2->current_buffer;
      prVar4 = prVar2->vertex_buffers;
      prVar5 = prVar4[lVar3].texcoords;
      iVar1 = prVar4[lVar3].tc_counter;
      prVar5[(long)iVar1 * 2] = fVar14;
      prVar5[iVar1 * 2 + 1] = fVar13;
      prVar4[lVar3].tc_counter = prVar4[lVar3].tc_counter + 1;
      rf_gfx_vertex3f(0.0,fVar12,prVar2->current_depth);
      prVar2 = (rf__ctx->field_0).current_batch;
      lVar3 = prVar2->current_buffer;
      prVar4 = prVar2->vertex_buffers;
      prVar5 = prVar4[lVar3].texcoords;
      iVar1 = prVar4[lVar3].tc_counter;
      prVar5[(long)iVar1 * 2] = fVar16;
      prVar5[iVar1 * 2 + 1] = fVar13;
      prVar4[lVar3].tc_counter = prVar4[lVar3].tc_counter + 1;
      rf_gfx_vertex3f(x,fVar12,prVar2->current_depth);
      prVar2 = (rf__ctx->field_0).current_batch;
      lVar3 = prVar2->current_buffer;
      prVar4 = prVar2->vertex_buffers;
      prVar5 = prVar4[lVar3].texcoords;
      iVar1 = prVar4[lVar3].tc_counter;
      prVar5[(long)iVar1 * 2] = fVar16;
      prVar5[iVar1 * 2 + 1] = fVar11;
      prVar4[lVar3].tc_counter = prVar4[lVar3].tc_counter + 1;
      rf_gfx_vertex3f(x,y,prVar2->current_depth);
      prVar2 = (rf__ctx->field_0).current_batch;
      lVar3 = prVar2->current_buffer;
      prVar4 = prVar2->vertex_buffers;
      prVar5 = prVar4[lVar3].texcoords;
      iVar1 = prVar4[lVar3].tc_counter;
      prVar5[(long)iVar1 * 2] = fVar14;
      prVar5[iVar1 * 2 + 1] = fVar11;
      prVar4[lVar3].tc_counter = prVar4[lVar3].tc_counter + 1;
      rf_gfx_vertex3f(0.0,y,prVar2->current_depth);
      if (bVar8 || bVar6) {
        prVar2 = (rf__ctx->field_0).current_batch;
        lVar3 = prVar2->current_buffer;
        prVar4 = prVar2->vertex_buffers;
        prVar5 = prVar4[lVar3].texcoords;
        iVar1 = prVar4[lVar3].tc_counter;
        prVar5[(long)iVar1 * 2] = fVar16;
        prVar5[iVar1 * 2 + 1] = fVar13;
        prVar4[lVar3].tc_counter = prVar4[lVar3].tc_counter + 1;
        rf_gfx_vertex3f(x,fVar12,prVar2->current_depth);
        prVar2 = (rf__ctx->field_0).current_batch;
        lVar3 = prVar2->current_buffer;
        prVar4 = prVar2->vertex_buffers;
        prVar5 = prVar4[lVar3].texcoords;
        iVar1 = prVar4[lVar3].tc_counter;
        prVar5[(long)iVar1 * 2] = fVar15;
        prVar5[iVar1 * 2 + 1] = fVar13;
        prVar4[lVar3].tc_counter = prVar4[lVar3].tc_counter + 1;
        rf_gfx_vertex3f(x_00,fVar12,prVar2->current_depth);
        prVar2 = (rf__ctx->field_0).current_batch;
        lVar3 = prVar2->current_buffer;
        prVar4 = prVar2->vertex_buffers;
        prVar5 = prVar4[lVar3].texcoords;
        iVar1 = prVar4[lVar3].tc_counter;
        prVar5[(long)iVar1 * 2] = fVar15;
        prVar5[iVar1 * 2 + 1] = fVar11;
        prVar4[lVar3].tc_counter = prVar4[lVar3].tc_counter + 1;
        rf_gfx_vertex3f(x_00,y,prVar2->current_depth);
        prVar2 = (rf__ctx->field_0).current_batch;
        lVar3 = prVar2->current_buffer;
        prVar4 = prVar2->vertex_buffers;
        prVar5 = prVar4[lVar3].texcoords;
        iVar1 = prVar4[lVar3].tc_counter;
        prVar5[(long)iVar1 * 2] = fVar16;
        prVar5[iVar1 * 2 + 1] = fVar11;
        prVar4[lVar3].tc_counter = prVar4[lVar3].tc_counter + 1;
        rf_gfx_vertex3f(x,y,prVar2->current_depth);
      }
      prVar2 = (rf__ctx->field_0).current_batch;
      lVar3 = prVar2->current_buffer;
      prVar4 = prVar2->vertex_buffers;
      prVar5 = prVar4[lVar3].texcoords;
      iVar1 = prVar4[lVar3].tc_counter;
      prVar5[(long)iVar1 * 2] = fVar15;
      prVar5[iVar1 * 2 + 1] = fVar13;
      prVar4[lVar3].tc_counter = prVar4[lVar3].tc_counter + 1;
      rf_gfx_vertex3f(x_00,fVar12,prVar2->current_depth);
      prVar2 = (rf__ctx->field_0).current_batch;
      lVar3 = prVar2->current_buffer;
      prVar4 = prVar2->vertex_buffers;
      prVar5 = prVar4[lVar3].texcoords;
      iVar1 = prVar4[lVar3].tc_counter;
      prVar5[(long)iVar1 * 2] = fVar9;
      prVar5[iVar1 * 2 + 1] = fVar13;
      prVar4[lVar3].tc_counter = prVar4[lVar3].tc_counter + 1;
      rf_gfx_vertex3f(x_01,fVar12,prVar2->current_depth);
      prVar2 = (rf__ctx->field_0).current_batch;
      lVar3 = prVar2->current_buffer;
      prVar4 = prVar2->vertex_buffers;
      prVar5 = prVar4[lVar3].texcoords;
      iVar1 = prVar4[lVar3].tc_counter;
      prVar5[(long)iVar1 * 2] = fVar9;
      prVar5[iVar1 * 2 + 1] = fVar11;
      prVar4[lVar3].tc_counter = prVar4[lVar3].tc_counter + 1;
      rf_gfx_vertex3f(x_01,y,prVar2->current_depth);
      prVar2 = (rf__ctx->field_0).current_batch;
      lVar3 = prVar2->current_buffer;
      prVar4 = prVar2->vertex_buffers;
      prVar5 = prVar4[lVar3].texcoords;
      iVar1 = prVar4[lVar3].tc_counter;
      prVar5[(long)iVar1 * 2] = fVar15;
      prVar5[iVar1 * 2 + 1] = fVar11;
      prVar4[lVar3].tc_counter = prVar4[lVar3].tc_counter + 1;
      fVar12 = prVar2->current_depth;
    }
  }
  rf_gfx_vertex3f(x_00,y,fVar12);
LAB_0014ee62:
  rf_gfx_end();
  rf_gfx_pop_matrix();
  rf_gfx_disable_texture();
  return;
}

Assistant:

RF_API void rf_draw_texture_npatch(rf_texture2d texture, rf_npatch_info n_patch_info, rf_rec dest_rec, rf_vec2 origin, float rotation, rf_color tint)
{
    if (texture.id > 0)
    {
        float width = (float)texture.width;
        float height = (float)texture.height;

        float patch_width = (dest_rec.width <= 0.0f)? 0.0f : dest_rec.width;
        float patch_height = (dest_rec.height <= 0.0f)? 0.0f : dest_rec.height;

        if (n_patch_info.source_rec.width < 0) n_patch_info.source_rec.x -= n_patch_info.source_rec.width;
        if (n_patch_info.source_rec.height < 0) n_patch_info.source_rec.y -= n_patch_info.source_rec.height;
        if (n_patch_info.type == RF_NPT_3PATCH_HORIZONTAL) patch_height = n_patch_info.source_rec.height;
        if (n_patch_info.type == RF_NPT_3PATCH_VERTICAL) patch_width = n_patch_info.source_rec.width;

        bool draw_center = true;
        bool draw_middle = true;
        float left_border = (float)n_patch_info.left;
        float top_border = (float)n_patch_info.top;
        float right_border = (float)n_patch_info.right;
        float bottom_border = (float)n_patch_info.bottom;

        // adjust the lateral (left and right) border widths in case patch_width < texture.width
        if (patch_width <= (left_border + right_border) && n_patch_info.type != RF_NPT_3PATCH_VERTICAL)
        {
            draw_center = false;
            left_border = (left_border / (left_border + right_border)) * patch_width;
            right_border = patch_width - left_border;
        }
        // adjust the lateral (top and bottom) border heights in case patch_height < texture.height
        if (patch_height <= (top_border + bottom_border) && n_patch_info.type != RF_NPT_3PATCH_HORIZONTAL)
        {
            draw_middle = false;
            top_border = (top_border / (top_border + bottom_border)) * patch_height;
            bottom_border = patch_height - top_border;
        }

        rf_vec2 vert_a, vert_b, vert_c, vert_d;
        vert_a.x = 0.0f; // outer left
        vert_a.y = 0.0f; // outer top
        vert_b.x = left_border; // inner left
        vert_b.y = top_border; // inner top
        vert_c.x = patch_width - right_border; // inner right
        vert_c.y = patch_height - bottom_border; // inner bottom
        vert_d.x = patch_width; // outer right
        vert_d.y = patch_height; // outer bottom

        rf_vec2 coord_a, coord_b, coord_c, coord_d;
        coord_a.x = n_patch_info.source_rec.x / width;
        coord_a.y = n_patch_info.source_rec.y / height;
        coord_b.x = (n_patch_info.source_rec.x + left_border) / width;
        coord_b.y = (n_patch_info.source_rec.y + top_border) / height;
        coord_c.x = (n_patch_info.source_rec.x + n_patch_info.source_rec.width - right_border) / width;
        coord_c.y = (n_patch_info.source_rec.y + n_patch_info.source_rec.height - bottom_border) / height;
        coord_d.x = (n_patch_info.source_rec.x + n_patch_info.source_rec.width) / width;
        coord_d.y = (n_patch_info.source_rec.y + n_patch_info.source_rec.height) / height;

        rf_gfx_enable_texture(texture.id);

        rf_gfx_push_matrix();
        rf_gfx_translatef(dest_rec.x, dest_rec.y, 0.0f);
        rf_gfx_rotatef(rotation, 0.0f, 0.0f, 1.0f);
        rf_gfx_translatef(-origin.x, -origin.y, 0.0f);

        rf_gfx_begin(RF_QUADS);
        rf_gfx_color4ub(tint.r, tint.g, tint.b, tint.a);
        rf_gfx_normal3f(0.0f, 0.0f, 1.0f); // Normal vector pointing towards viewer

        if (n_patch_info.type == RF_NPT_9PATCH)
        {
            // ------------------------------------------------------------
            // TOP-LEFT QUAD
            rf_gfx_tex_coord2f(coord_a.x, coord_b.y); rf_gfx_vertex2f(vert_a.x, vert_b.y); // Bottom-left corner for texture and quad
            rf_gfx_tex_coord2f(coord_b.x, coord_b.y); rf_gfx_vertex2f(vert_b.x, vert_b.y); // Bottom-right corner for texture and quad
            rf_gfx_tex_coord2f(coord_b.x, coord_a.y); rf_gfx_vertex2f(vert_b.x, vert_a.y); // Top-right corner for texture and quad
            rf_gfx_tex_coord2f(coord_a.x, coord_a.y); rf_gfx_vertex2f(vert_a.x, vert_a.y); // Top-left corner for texture and quad
            if (draw_center)
            {
                // TOP-CENTER QUAD
                rf_gfx_tex_coord2f(coord_b.x, coord_b.y); rf_gfx_vertex2f(vert_b.x, vert_b.y); // Bottom-left corner for texture and quad
                rf_gfx_tex_coord2f(coord_c.x, coord_b.y); rf_gfx_vertex2f(vert_c.x, vert_b.y); // Bottom-right corner for texture and quad
                rf_gfx_tex_coord2f(coord_c.x, coord_a.y); rf_gfx_vertex2f(vert_c.x, vert_a.y); // Top-right corner for texture and quad
                rf_gfx_tex_coord2f(coord_b.x, coord_a.y); rf_gfx_vertex2f(vert_b.x, vert_a.y); // Top-left corner for texture and quad
            }
            // TOP-RIGHT QUAD
            rf_gfx_tex_coord2f(coord_c.x, coord_b.y); rf_gfx_vertex2f(vert_c.x, vert_b.y); // Bottom-left corner for texture and quad
            rf_gfx_tex_coord2f(coord_d.x, coord_b.y); rf_gfx_vertex2f(vert_d.x, vert_b.y); // Bottom-right corner for texture and quad
            rf_gfx_tex_coord2f(coord_d.x, coord_a.y); rf_gfx_vertex2f(vert_d.x, vert_a.y); // Top-right corner for texture and quad
            rf_gfx_tex_coord2f(coord_c.x, coord_a.y); rf_gfx_vertex2f(vert_c.x, vert_a.y); // Top-left corner for texture and quad
            if (draw_middle)
            {
                // ------------------------------------------------------------
                // MIDDLE-LEFT QUAD
                rf_gfx_tex_coord2f(coord_a.x, coord_c.y); rf_gfx_vertex2f(vert_a.x, vert_c.y); // Bottom-left corner for texture and quad
                rf_gfx_tex_coord2f(coord_b.x, coord_c.y); rf_gfx_vertex2f(vert_b.x, vert_c.y); // Bottom-right corner for texture and quad
                rf_gfx_tex_coord2f(coord_b.x, coord_b.y); rf_gfx_vertex2f(vert_b.x, vert_b.y); // Top-right corner for texture and quad
                rf_gfx_tex_coord2f(coord_a.x, coord_b.y); rf_gfx_vertex2f(vert_a.x, vert_b.y); // Top-left corner for texture and quad
                if (draw_center)
                {
                    // MIDDLE-CENTER QUAD
                    rf_gfx_tex_coord2f(coord_b.x, coord_c.y); rf_gfx_vertex2f(vert_b.x, vert_c.y); // Bottom-left corner for texture and quad
                    rf_gfx_tex_coord2f(coord_c.x, coord_c.y); rf_gfx_vertex2f(vert_c.x, vert_c.y); // Bottom-right corner for texture and quad
                    rf_gfx_tex_coord2f(coord_c.x, coord_b.y); rf_gfx_vertex2f(vert_c.x, vert_b.y); // Top-right corner for texture and quad
                    rf_gfx_tex_coord2f(coord_b.x, coord_b.y); rf_gfx_vertex2f(vert_b.x, vert_b.y); // Top-left corner for texture and quad
                }

                // MIDDLE-RIGHT QUAD
                rf_gfx_tex_coord2f(coord_c.x, coord_c.y); rf_gfx_vertex2f(vert_c.x, vert_c.y); // Bottom-left corner for texture and quad
                rf_gfx_tex_coord2f(coord_d.x, coord_c.y); rf_gfx_vertex2f(vert_d.x, vert_c.y); // Bottom-right corner for texture and quad
                rf_gfx_tex_coord2f(coord_d.x, coord_b.y); rf_gfx_vertex2f(vert_d.x, vert_b.y); // Top-right corner for texture and quad
                rf_gfx_tex_coord2f(coord_c.x, coord_b.y); rf_gfx_vertex2f(vert_c.x, vert_b.y); // Top-left corner for texture and quad
            }

            // ------------------------------------------------------------
            // BOTTOM-LEFT QUAD
            rf_gfx_tex_coord2f(coord_a.x, coord_d.y); rf_gfx_vertex2f(vert_a.x, vert_d.y); // Bottom-left corner for texture and quad
            rf_gfx_tex_coord2f(coord_b.x, coord_d.y); rf_gfx_vertex2f(vert_b.x, vert_d.y); // Bottom-right corner for texture and quad
            rf_gfx_tex_coord2f(coord_b.x, coord_c.y); rf_gfx_vertex2f(vert_b.x, vert_c.y); // Top-right corner for texture and quad
            rf_gfx_tex_coord2f(coord_a.x, coord_c.y); rf_gfx_vertex2f(vert_a.x, vert_c.y); // Top-left corner for texture and quad
            if (draw_center)
            {
                // BOTTOM-CENTER QUAD
                rf_gfx_tex_coord2f(coord_b.x, coord_d.y); rf_gfx_vertex2f(vert_b.x, vert_d.y); // Bottom-left corner for texture and quad
                rf_gfx_tex_coord2f(coord_c.x, coord_d.y); rf_gfx_vertex2f(vert_c.x, vert_d.y); // Bottom-right corner for texture and quad
                rf_gfx_tex_coord2f(coord_c.x, coord_c.y); rf_gfx_vertex2f(vert_c.x, vert_c.y); // Top-right corner for texture and quad
                rf_gfx_tex_coord2f(coord_b.x, coord_c.y); rf_gfx_vertex2f(vert_b.x, vert_c.y); // Top-left corner for texture and quad
            }

            // BOTTOM-RIGHT QUAD
            rf_gfx_tex_coord2f(coord_c.x, coord_d.y); rf_gfx_vertex2f(vert_c.x, vert_d.y); // Bottom-left corner for texture and quad
            rf_gfx_tex_coord2f(coord_d.x, coord_d.y); rf_gfx_vertex2f(vert_d.x, vert_d.y); // Bottom-right corner for texture and quad
            rf_gfx_tex_coord2f(coord_d.x, coord_c.y); rf_gfx_vertex2f(vert_d.x, vert_c.y); // Top-right corner for texture and quad
            rf_gfx_tex_coord2f(coord_c.x, coord_c.y); rf_gfx_vertex2f(vert_c.x, vert_c.y); // Top-left corner for texture and quad
        }
        else if (n_patch_info.type == RF_NPT_3PATCH_VERTICAL)
        {
            // TOP QUAD
            // -----------------------------------------------------------
            // rf_texture coords                 Vertices
            rf_gfx_tex_coord2f(coord_a.x, coord_b.y); rf_gfx_vertex2f(vert_a.x, vert_b.y); // Bottom-left corner for texture and quad
            rf_gfx_tex_coord2f(coord_d.x, coord_b.y); rf_gfx_vertex2f(vert_d.x, vert_b.y); // Bottom-right corner for texture and quad
            rf_gfx_tex_coord2f(coord_d.x, coord_a.y); rf_gfx_vertex2f(vert_d.x, vert_a.y); // Top-right corner for texture and quad
            rf_gfx_tex_coord2f(coord_a.x, coord_a.y); rf_gfx_vertex2f(vert_a.x, vert_a.y); // Top-left corner for texture and quad
            if (draw_center)
            {
                // MIDDLE QUAD
                // -----------------------------------------------------------
                // rf_texture coords                 Vertices
                rf_gfx_tex_coord2f(coord_a.x, coord_c.y); rf_gfx_vertex2f(vert_a.x, vert_c.y); // Bottom-left corner for texture and quad
                rf_gfx_tex_coord2f(coord_d.x, coord_c.y); rf_gfx_vertex2f(vert_d.x, vert_c.y); // Bottom-right corner for texture and quad
                rf_gfx_tex_coord2f(coord_d.x, coord_b.y); rf_gfx_vertex2f(vert_d.x, vert_b.y); // Top-right corner for texture and quad
                rf_gfx_tex_coord2f(coord_a.x, coord_b.y); rf_gfx_vertex2f(vert_a.x, vert_b.y); // Top-left corner for texture and quad
            }
            // BOTTOM QUAD
            // -----------------------------------------------------------
            // rf_texture coords                 Vertices
            rf_gfx_tex_coord2f(coord_a.x, coord_d.y); rf_gfx_vertex2f(vert_a.x, vert_d.y); // Bottom-left corner for texture and quad
            rf_gfx_tex_coord2f(coord_d.x, coord_d.y); rf_gfx_vertex2f(vert_d.x, vert_d.y); // Bottom-right corner for texture and quad
            rf_gfx_tex_coord2f(coord_d.x, coord_c.y); rf_gfx_vertex2f(vert_d.x, vert_c.y); // Top-right corner for texture and quad
            rf_gfx_tex_coord2f(coord_a.x, coord_c.y); rf_gfx_vertex2f(vert_a.x, vert_c.y); // Top-left corner for texture and quad
        }
        else if (n_patch_info.type == RF_NPT_3PATCH_HORIZONTAL)
        {
            // LEFT QUAD
            // -----------------------------------------------------------
            // rf_texture coords                 Vertices
            rf_gfx_tex_coord2f(coord_a.x, coord_d.y); rf_gfx_vertex2f(vert_a.x, vert_d.y); // Bottom-left corner for texture and quad
            rf_gfx_tex_coord2f(coord_b.x, coord_d.y); rf_gfx_vertex2f(vert_b.x, vert_d.y); // Bottom-right corner for texture and quad
            rf_gfx_tex_coord2f(coord_b.x, coord_a.y); rf_gfx_vertex2f(vert_b.x, vert_a.y); // Top-right corner for texture and quad
            rf_gfx_tex_coord2f(coord_a.x, coord_a.y); rf_gfx_vertex2f(vert_a.x, vert_a.y); // Top-left corner for texture and quad
            if (draw_center)
            {
                // CENTER QUAD
                // -----------------------------------------------------------
                // rf_texture coords                 Vertices
                rf_gfx_tex_coord2f(coord_b.x, coord_d.y); rf_gfx_vertex2f(vert_b.x, vert_d.y); // Bottom-left corner for texture and quad
                rf_gfx_tex_coord2f(coord_c.x, coord_d.y); rf_gfx_vertex2f(vert_c.x, vert_d.y); // Bottom-right corner for texture and quad
                rf_gfx_tex_coord2f(coord_c.x, coord_a.y); rf_gfx_vertex2f(vert_c.x, vert_a.y); // Top-right corner for texture and quad
                rf_gfx_tex_coord2f(coord_b.x, coord_a.y); rf_gfx_vertex2f(vert_b.x, vert_a.y); // Top-left corner for texture and quad
            }
            // RIGHT QUAD
            // -----------------------------------------------------------
            // rf_texture coords                 Vertices
            rf_gfx_tex_coord2f(coord_c.x, coord_d.y); rf_gfx_vertex2f(vert_c.x, vert_d.y); // Bottom-left corner for texture and quad
            rf_gfx_tex_coord2f(coord_d.x, coord_d.y); rf_gfx_vertex2f(vert_d.x, vert_d.y); // Bottom-right corner for texture and quad
            rf_gfx_tex_coord2f(coord_d.x, coord_a.y); rf_gfx_vertex2f(vert_d.x, vert_a.y); // Top-right corner for texture and quad
            rf_gfx_tex_coord2f(coord_c.x, coord_a.y); rf_gfx_vertex2f(vert_c.x, vert_a.y); // Top-left corner for texture and quad
        }
        rf_gfx_end();
        rf_gfx_pop_matrix();

        rf_gfx_disable_texture();

    }
}